

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

void __thiscall
dg::dda::MemorySSATransformation::addDefinitionsFromCalledValue
          (MemorySSATransformation *this,RWNode *phi,RWNodeCall *C,DefSite *ds,RWNode *calledValue)

{
  iterator this_00;
  RWNode *in_RDX;
  RWNode *in_RDI;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> defSet;
  Definitions D;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> defs;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  *in_stack_fffffffffffffec8;
  DefSite *in_stack_fffffffffffffef0;
  Definitions *in_stack_fffffffffffffef8;
  RWNode *in_stack_ffffffffffffff10;
  _Rb_tree_const_iterator<dg::dda::RWNode_*> in_stack_ffffffffffffff18;
  _Rb_tree_const_iterator<dg::dda::RWNode_*> in_stack_ffffffffffffff20;
  const_iterator in_stack_ffffffffffffff28;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_ffffffffffffff80;
  DefSite *in_stack_ffffffffffffff88;
  Definitions *in_stack_ffffffffffffff90;
  RWBBlock *in_stack_ffffffffffffff98;
  MemorySSATransformation *in_stack_ffffffffffffffa0;
  
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::vector
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)0x1744e9);
  Definitions::Definitions((Definitions *)in_RDI);
  Definitions::update((Definitions *)in_stack_ffffffffffffff20._M_node,
                      (RWNode *)in_stack_ffffffffffffff18._M_node,in_stack_ffffffffffffff10);
  Definitions::get(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
             in_stack_fffffffffffffec8);
  __gnu_cxx::
  __normal_iterator<dg::dda::RWNode*const*,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
  ::__normal_iterator<dg::dda::RWNode**>
            ((__normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
              *)in_RDI,
             (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
              *)in_stack_fffffffffffffec8);
  std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
  begin(in_stack_fffffffffffffec8);
  this_00 = std::
            set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
            ::end(in_stack_fffffffffffffec8);
  std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
  insert<std::_Rb_tree_const_iterator<dg::dda::RWNode*>,void>
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  RWNode::getBBlock(in_RDX);
  addUncoveredFromPredecessors
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  RWNode::addDefUse<std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
            (in_RDI,(vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                    in_stack_fffffffffffffec8);
  std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
  ~set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *)
       0x1745ce);
  Definitions::~Definitions((Definitions *)in_RDI);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~vector
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)this_00._M_node);
  return;
}

Assistant:

void MemorySSATransformation::addDefinitionsFromCalledValue(
        RWNode *phi, RWNodeCall *C, const DefSite &ds, RWNode *calledValue) {
    std::vector<RWNode *> defs;
    Definitions D;
    // FIXME: cache this somehow ?
    D.update(calledValue);

    auto defSet = D.get(ds);
    assert((!defSet.empty() || D.unknownWrites.empty()) &&
           "BUG: if we found no definitions, also unknown writes must be "
           "empty");
    defs.insert(defs.end(), defSet.begin(), defSet.end());
    addUncoveredFromPredecessors(C->getBBlock(), D, ds, defs);
    phi->addDefUse(defs);
}